

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall
cmCTest::RunTest(cmCTest *this,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *argv,string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  string *file1;
  pointer pbVar2;
  pointer this_01;
  __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  this_02;
  int *piVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  string *file2;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> this_03;
  cmUVProcessChainBuilder *this_04;
  uv_loop_t *puVar10;
  uv_pipe_s *handle;
  uv_stream_t *stream;
  undefined8 *puVar11;
  ulong uVar12;
  pointer pcVar13;
  Status *this_05;
  SaveRestoreEnvironment *this_06;
  uint uVar14;
  pointer pbVar15;
  undefined4 uVar16;
  undefined8 unaff_R14;
  pointer __p;
  size_t __n;
  cmDuration cVar17;
  cmDuration cVar18;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  cmProcessOutput processOutput;
  vector<char,_std::allocator<char>_> tempOutput;
  cmUVProcessChain chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  cmCTest inst;
  uv_pipe_ptr outputStream;
  cmUVProcessChainBuilder builder;
  ostringstream cmCTestLog_msg;
  cmProcessOutput local_439;
  string *local_438;
  cmDuration local_430;
  vector<char,_std::allocator<char>_> local_428;
  undefined1 local_410 [8];
  undefined1 local_408 [16];
  pointer local_3f8;
  pointer local_3e8;
  undefined1 local_3e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  uv_loop_t *local_3b8;
  __uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  local_3b0;
  cmCTest local_3a8 [2];
  long local_398 [2];
  int *local_388;
  ostream *local_380;
  vector<char,_std::allocator<char>_> local_378;
  uv_handle_ptr_base_<uv_pipe_s> local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_340;
  pointer local_338;
  undefined8 uStack_330;
  undefined1 local_320 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_308;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  undefined8 local_180;
  ios_base local_138 [264];
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = (undefined4)
             CONCAT71((int7)((ulong)unaff_R14 >> 8),
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start !=
                      (environment->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_438 = output;
  local_3e8 = (pointer)testTimeOut.__r;
  local_380 = log;
  local_340 = environment;
  cVar17 = cmCTestScriptHandler::GetRemainingTimeAllowed
                     (&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                       ScriptHandler);
  local_430.__r =
       (rep_conflict)
       (~-(ulong)(cVar17.__r != 10000000.0) & (ulong)cVar17.__r |
       (ulong)(cVar17.__r + -120.0) & -(ulong)(cVar17.__r != 10000000.0));
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  cVar17.__r = ((_Var1._M_head_impl)->TimeOut).__r;
  uVar19 = extraout_XMM0_Qb;
  if ((0.0 < cVar17.__r) && (cVar17.__r < local_430.__r)) {
    uVar19 = 0;
    local_430.__r = cVar17.__r;
  }
  cVar17.__r = local_430.__r;
  if ((0.0 < (double)local_3e8) &&
     (local_338 = (pointer)local_430.__r, uStack_330 = uVar19,
     cVar18 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var1._M_head_impl)->ScriptHandler),
     cVar17.__r = (rep_conflict)local_338, (double)local_3e8 < cVar18.__r)) {
    local_430.__r = (rep_conflict)local_3e8;
    cVar17.__r = (rep_conflict)local_3e8;
  }
  if (cVar17.__r <= 0.0) {
    local_430.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Test timeout computed to be: ",0x1d);
  if ((local_430.__r != 10000000.0) || (NAN(local_430.__r))) {
    uVar8 = cmDurationTo<unsigned_int>(&local_430);
    cVar5 = '\x01';
    if (9 < uVar8) {
      uVar14 = uVar8;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar14 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_001a0cb8;
        }
        if (uVar14 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_001a0cb8;
        }
        if (uVar14 < 10000) goto LAB_001a0cb8;
        bVar6 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar6);
      cVar5 = cVar5 + '\x01';
    }
LAB_001a0cb8:
    local_320._0_8_ = (long)local_320 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_320,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_320._0_8_,local_320._8_4_,uVar8);
  }
  else {
    local_320._0_8_ = (long)local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"infinite","");
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_320._0_8_,
                      CONCAT44(local_320._12_4_,local_320._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if (local_320._0_8_ != (long)local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0x4cd,(char *)local_320._0_8_,false);
  if (local_320._0_8_ != (long)local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  file1 = (argv->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  file2 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar6 = cmsys::SystemTools::SameFile(file1,file2);
  local_388 = retVal;
  if ((bVar6) &&
     (((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess == false
     )) {
    cmCTest(local_3a8);
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)local_3a8[0].Impl._M_t.
                      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                      .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 8));
    local_338 = (pointer)CONCAT44(local_338._4_4_,uVar16);
    ((cmDuration *)
    ((long)local_3a8[0].Impl._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3aa0))->__r =
         local_430.__r;
    local_3e8 = (pointer)this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(ostringstream **)
     ((long)local_3a8[0].Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3b48) =
         (ostringstream *)local_1a8;
    *(ostringstream **)
     ((long)local_3a8[0].Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl + 0x3b50) =
         (ostringstream *)local_1a8;
    local_408._0_4_ = None;
    local_408._4_4_ = 0;
    local_408._8_4_ = None;
    local_408._12_4_ = 0;
    local_3f8 = (pointer)0x0;
    pbVar15 = (argv->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (argv->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar15 != pbVar2) {
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_410 + 8)
      ;
      do {
        iVar7 = std::__cxx11::string::compare((char *)pbVar15);
        if ((iVar7 == 0) &&
           (((local_430.__r != 10000000.0 || (NAN(local_430.__r))) && (0.0 < local_430.__r)))) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[15]>(this_00,(char (*) [15])"--test-timeout");
          uVar8 = cmDurationTo<unsigned_int>(&local_430);
          cVar5 = '\x01';
          if (9 < uVar8) {
            uVar14 = uVar8;
            cVar4 = '\x04';
            do {
              cVar5 = cVar4;
              if (uVar14 < 100) {
                cVar5 = cVar5 + -2;
                goto LAB_001a1541;
              }
              if (uVar14 < 1000) {
                cVar5 = cVar5 + -1;
                goto LAB_001a1541;
              }
              if (uVar14 < 10000) goto LAB_001a1541;
              bVar6 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              cVar4 = cVar5 + '\x04';
            } while (bVar6);
            cVar5 = cVar5 + '\x01';
          }
LAB_001a1541:
          local_320._0_8_ = (long)local_320 + 0x10;
          std::__cxx11::string::_M_construct((ulong)local_320,cVar5);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_320._0_8_,local_320._8_4_,uVar8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_320);
          if (local_320._0_8_ != (long)local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>(this_00,pbVar15);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar2);
    }
    poVar9 = local_380;
    if (local_380 != (ostream *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_380,"* Run internal CTest",0x14);
      cVar5 = (char)poVar9;
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
    }
    piVar3 = local_388;
    this_01 = local_3e8;
    local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if ((char)local_338 != '\0') {
      this_06 = (SaveRestoreEnvironment *)operator_new(0x18);
      cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(this_06);
      pcVar13 = local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_320._0_4_ = None;
      local_320._4_4_ = 0;
      bVar6 = (SaveRestoreEnvironment *)
              local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (SaveRestoreEnvironment *)0x0;
      local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)this_06;
      if (bVar6) {
        cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment
                  ((SaveRestoreEnvironment *)pcVar13);
        operator_delete(pcVar13,0x18);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)local_320);
      cmSystemTools::AppendEnv(local_340);
    }
    iVar7 = Run(local_3a8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_410 + 8),local_438);
    *piVar3 = iVar7;
    if (local_438 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_438,local_320._0_8_);
      if (local_320._0_8_ != (long)local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      if (local_438 != (string *)0x0 && local_380 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_380,(local_438->_M_dataplus)._M_p,local_438->_M_string_length);
      }
      if (local_438 != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_320 + (char)*(undefined8 *)(local_320._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_320);
        poVar9 = (ostream *)std::ostream::flush();
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(local_438->_M_dataplus)._M_p,local_438->_M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log((cmCTest *)this_01,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x4f9,(char *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_),false);
        if ((undefined1 *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_) != local_3e0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_),
                          local_3e0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
      }
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&local_428);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_410 + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::~unique_ptr
              (&local_3a8[0].Impl);
    bVar6 = true;
  }
  else {
    local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (local_438 != (string *)0x0) {
      local_438->_M_string_length = 0;
      *(local_438->_M_dataplus)._M_p = '\0';
    }
    local_3b0._M_t.
    super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
         (tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
          )(_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
            )0x0;
    if ((char)uVar16 != '\0') {
      this_03._M_head_impl = (SaveRestoreEnvironment *)operator_new(0x18);
      cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(this_03._M_head_impl);
      this_02._M_t.
      super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
           local_3b0._M_t.
           super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
           .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl;
      local_1a8._0_8_ =
           (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
            )0x0;
      bVar6 = local_3b0._M_t.
              super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
               )0x0;
      local_3b0._M_t.
      super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>._M_head_impl =
           (tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
            )(tuple<cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )this_03._M_head_impl;
      if (bVar6) {
        cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment
                  ((SaveRestoreEnvironment *)
                   this_02._M_t.
                   super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   .super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>.
                   _M_head_impl);
        operator_delete((void *)this_02._M_t.
                                super__Tuple_impl<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                                .
                                super__Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false>
                                ._M_head_impl,0x18);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)local_1a8);
      cmSystemTools::AppendEnv(local_340);
    }
    cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_320);
    this_04 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_320,argv);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_04);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Command is: ",0xc);
    pbVar15 = (argv->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x50b,(char *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_),false);
    if ((undefined1 *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_) != local_3e0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_),local_3e0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_410);
    cmProcessOutput::cmProcessOutput(&local_439,encoding,0x400);
    local_358.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_358.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar10 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_410);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_358,(EVP_PKEY_CTX *)puVar10);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       ((uv_handle_ptr_<uv_pipe_s> *)&local_358);
    iVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_410);
    uv_pipe_open(handle,iVar7);
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_358);
    puVar10 = (uv_loop_t *)operator_new(0x58);
    *(undefined8 *)&puVar10->backend_fd = 0;
    puVar10->pending_queue[0] = (_Manager_type)0x0;
    *(_Invoker_type *)&puVar10->stop_flag = (_Invoker_type)0x0;
    *(undefined8 *)&(((function<void_()> *)&puVar10->flags)->super__Function_base)._M_functor = 0;
    (puVar10->active_reqs).unused = (void *)0x0;
    puVar10->internal_fields = (_Manager_type)0x0;
    puVar10->handle_queue[0] = (pointer)0x0;
    puVar10->handle_queue[1] = (void *)0x0;
    (((vector<char,_std::allocator<char>_> *)&puVar10->data)->
    super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    *(pointer *)&puVar10->active_handles = (pointer)0x0;
    puVar10->pending_queue[1] = (void *)0x0;
    local_3b8 = puVar10;
    puVar11 = (undefined8 *)operator_new(0x28);
    *puVar11 = this;
    puVar11[1] = &local_439;
    puVar11[2] = &local_438;
    puVar11[3] = &local_428;
    puVar11[4] = &local_380;
    puVar10->handle_queue[1] = puVar11;
    (puVar10->active_reqs).unused = (void *)0x0;
    puVar10->internal_fields =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5)>
         ::_M_manager;
    *(code **)&puVar10->stop_flag =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5)>
         ::_M_invoke;
    puVar11 = (undefined8 *)operator_new(0x18);
    *puVar11 = this;
    puVar11[1] = &local_439;
    puVar11[2] = &local_380;
    *(undefined8 **)&(((function<void_()> *)&puVar10->flags)->super__Function_base)._M_functor =
         puVar11;
    *(undefined8 *)&puVar10->backend_fd = 0;
    puVar10->pending_queue[0] =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
         ::_M_manager;
    puVar10->pending_queue[1] =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
         ::_M_invoke;
    stream->data = puVar10;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1300:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1313:5)>
                  ::anon_class_1_0_00000001::__invoke);
    uVar12 = (ulong)(local_430.__r * 1000.0);
    bVar6 = cmUVProcessChain::Wait
                      ((cmUVProcessChain *)local_410,
                       (long)(local_430.__r * 1000.0 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f
                       | uVar12);
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar12 = (long)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar12 == 0) {
      pcVar13 = (pointer)0x0;
      __n = 0;
    }
    else {
      if ((long)uVar12 < 0) {
        std::__throw_bad_alloc();
      }
      pcVar13 = (pointer)operator_new(uVar12);
      __n = (long)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar13 + uVar12;
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar13;
    if (local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar13;
      memmove(pcVar13,local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,__n);
    }
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar13 + __n;
    cmProcessOutput::DecodeText(&local_439,&local_378,&local_428,0);
    if (local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((local_438 != (string *)0x0) &&
       (local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      std::__cxx11::string::append
                ((char *)local_438,
                 (ulong)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"-- Process completed",0x14);
    std::ios::widen((char)(ostream *)local_1a8 +
                    (char)(((SaveRestoreEnvironment *)(local_1a8._0_8_ + -0x18))->Env).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x533,(char *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_),false);
    if ((undefined1 *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_) != local_3e0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_3e0._4_4_,local_3e0._0_4_),local_3e0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (bVar6) {
      this_05 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_410,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_3e0,this_05);
      if (local_3e0._0_4_ == None) {
        iVar7 = (int)this_05->ExitStatus;
        *local_388 = iVar7;
        bVar6 = true;
        if ((iVar7 != 0) &&
           (((this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
            OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&local_428);
        }
      }
      else {
        if (local_3e0._0_4_ == Spawn) {
          local_1a8._0_8_ = (SaveRestoreEnvironment *)0x16;
          local_1a8._8_8_ = "\n*** ERROR executing: ";
          local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_190 = local_3e0._16_8_;
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e0._8_8_;
          local_180 = 0;
          views._M_len = 2;
          views._M_array = (iterator)local_1a8;
          cmCatViews((string *)(local_410 + 8),views);
          if (local_438 != (string *)0x0) {
            std::__cxx11::string::_M_append((char *)local_438,local_408._0_8_);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_408._0_8_,local_408._8_8_);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0x548,(char *)local_3a8[0].Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,false);
        }
        else {
          if (((this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
              OutputTestOutputOnTestFailure == true) {
            OutputTestErrors(this,&local_428);
          }
          *local_388 = this_05->TermSignal;
          local_1a8._0_8_ = (SaveRestoreEnvironment *)0x1a;
          local_1a8._8_8_ = "\n*** Exception executing: ";
          local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_190 = local_3e0._16_8_;
          local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e0._8_8_;
          local_180 = 0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_1a8;
          cmCatViews((string *)(local_410 + 8),views_00);
          if (local_438 != (string *)0x0) {
            std::__cxx11::string::_M_append((char *)local_438,local_408._0_8_);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_408._0_8_,local_408._8_8_);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(this,5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
              ,0x554,(char *)local_3a8[0].Impl._M_t.
                             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                             .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,false);
        }
        if (local_3a8[0].Impl._M_t.
            super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
            super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
            super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl !=
            (unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>)local_398) {
          operator_delete((void *)local_3a8[0].Impl._M_t.
                                  super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                  .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,
                          local_398[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (local_408._0_8_ != (long)local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,
                          (ulong)((long)&(local_3f8->Arguments).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data + 1));
        }
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._8_8_ != &local_3c8) {
        operator_delete((void *)local_3e0._8_8_,local_3c8._0_8_ + 1);
      }
    }
    else {
      bVar6 = false;
    }
    if (local_3b8 != (uv_loop_t *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_3b8,
                 (cmUVStreamReadHandle *)local_3b8);
    }
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_358);
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_p != local_2e0) {
      operator_delete(local_2f0._M_p,local_2e0[0]._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&local_308);
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)&local_3b0);
    if (local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_428.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar6;
}

Assistant:

bool cmCTest::RunTest(const std::vector<std::string>& argv,
                      std::string* output, int* retVal, std::ostream* log,
                      cmDuration testTimeOut,
                      std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (auto const& i : argv) {
      // make sure we pass the timeout in for any build and test
      // invocations. Since --build-generator is required this is a
      // good place to check for it, and to add the arguments in
      if (i == "--build-generator" && timeout != cmCTest::MaxDuration() &&
          timeout > cmDuration::zero()) {
        args.emplace_back("--test-timeout");
        args.push_back(std::to_string(cmDurationTo<unsigned int>(timeout)));
      }
      args.emplace_back(i);
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return true;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmUVProcessChainBuilder builder;
  builder.AddCommand(argv).SetMergedBuiltinStreams();
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  auto chain = builder.Start();

  cmProcessOutput processOutput(encoding);
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tempOutput,
     &log](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      if (output) {
        cm::append(tempOutput, data.data(), data.data() + data.size());
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (log) {
        log->write(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &log]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (log) {
          log->write(strdata.c_str(), strdata.size());
        }
      }
    });

  bool complete = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  bool result = false;

  if (complete) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        result = true;
        break;
      case cmUVProcessChain::ExceptionCode::Spawn: {
        std::string outerr =
          cmStrCat("\n*** ERROR executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
      default: {
        if (this->Impl->OutputTestOutputOnTestFailure) {
          this->OutputTestErrors(tempOutput);
        }
        *retVal = status.TermSignal;
        std::string outerr =
          cmStrCat("\n*** Exception executing: ", exception.second);
        if (output) {
          *output += outerr;
        }
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr << std::endl);
      } break;
    }
  }

  return result;
}